

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparspak.cpp
# Opt level: O3

void sp_solve(int neqns,int *xlnz,double *lnz,int *xnzsub,int *nzsub,double *diag,double *rhs)

{
  double dVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  bool bVar7;
  double dVar8;
  
  if (0 < neqns) {
    uVar4 = 1;
    iVar5 = *xlnz;
    do {
      dVar8 = rhs[uVar4 - 1];
      dVar1 = diag[uVar4 - 1];
      rhs[uVar4 - 1] = dVar8 / dVar1;
      iVar2 = xlnz[uVar4];
      if (iVar5 < iVar2) {
        iVar3 = xnzsub[uVar4 - 1];
        lVar6 = 0;
        do {
          rhs[(long)nzsub[(long)iVar3 + lVar6 + -1] + -1] =
               rhs[(long)nzsub[(long)iVar3 + lVar6 + -1] + -1] -
               lnz[(long)iVar5 + lVar6 + -1] * (dVar8 / dVar1);
          lVar6 = lVar6 + 1;
        } while ((long)iVar2 - (long)iVar5 != lVar6);
      }
      uVar4 = uVar4 + 1;
      iVar5 = iVar2;
    } while (uVar4 != neqns + 1);
    if (0 < neqns) {
      uVar4 = (ulong)(uint)neqns;
      iVar5 = 1;
      do {
        dVar8 = rhs[uVar4 - 1];
        iVar2 = xlnz[uVar4 - 1];
        if (iVar2 < xlnz[uVar4]) {
          lVar6 = 0;
          do {
            dVar8 = dVar8 - lnz[(long)iVar2 + lVar6 + -1] *
                            rhs[(long)nzsub[(long)xnzsub[uVar4 - 1] + lVar6 + -1] + -1];
            lVar6 = lVar6 + 1;
          } while ((long)xlnz[uVar4] - (long)iVar2 != lVar6);
        }
        rhs[uVar4 - 1] = dVar8 / diag[uVar4 - 1];
        uVar4 = uVar4 - 1;
        bVar7 = iVar5 != neqns;
        iVar5 = iVar5 + 1;
      } while (bVar7);
    }
  }
  return;
}

Assistant:

void sp_solve(int neqns, int* xlnz, double* lnz, int* xnzsub,
           int* nzsub, double* diag, double* rhs)
{
    int i, isub;
    double rhsj, s;

    /* Adjust from C to Fortran */

    --xlnz; --lnz; --xnzsub; --nzsub; --diag; --rhs;

    /* Forward substitution */

    for (int j = 1; j <= neqns; j++)
    {
        rhsj = rhs[j] / diag[j];
        rhs[j] = rhsj;
        i = xnzsub[j];
        for (int ii = xlnz[j]; ii < xlnz[j+1]; ii++)
        {
            isub = nzsub[i];
            rhs[isub] -= lnz[ii] * rhsj;
            i += 1;
        }
    }

    /* Backward substitution */

    int j = neqns;
    for (int jj = 1; jj <= neqns; jj++)
    {
        s = rhs[j];
        i = xnzsub[j];
        for (int ii = xlnz[j]; ii < xlnz[j+1]; ii++)
        {
            isub = nzsub[i];
            s -= lnz[ii] * rhs[isub];
            i += 1;
        }
        rhs[j] = s / diag[j];
        j -= 1;
    }

    /* Adjust from Fortran to C */

    ++xlnz; ++lnz; ++xnzsub; ++nzsub; ++diag; ++rhs;

}